

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_timeout.cpp
# Opt level: O2

void __thiscall tst_qpromise_timeout::rejectedStdChrono(tst_qpromise_timeout *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  char16_t *pcVar3;
  _func_int **pp_Var4;
  bool bVar5;
  PromiseData<int> *pPVar6;
  QSlotObjectBase *pQVar7;
  PromiseDataBase<void,_void_()> *this_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar8;
  QPromiseReject<int> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_1b0;
  PromiseResolver<int> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_1a0;
  _Any_data local_198;
  undefined **local_188;
  PromiseData<int> *pPStack_180;
  QPromise<int> p_1;
  PromiseResolver<void> resolver_1;
  QPromiseBase<int> local_148;
  QArrayDataPointer<char16_t> local_138;
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_110;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_108;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_100;
  PromiseResolver<int> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_c8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_c0;
  QPromiseBase<int> local_b8;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  undefined **local_88;
  qint64 elapsed;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _func_int **local_58;
  QPromiseBase<int> local_50;
  QElapsedTimer timer;
  
  timer.t1 = -0x8000000000000000;
  timer.t2 = -0x8000000000000000;
  elapsed = -1;
  QElapsedTimer::start();
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ba98;
  pPVar6 = (PromiseData<int> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_198._M_unused._M_object = &PTR__QPromiseBase_0011bac8;
  local_198._8_8_ = pPVar6;
  local_b8.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_198);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_198);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_78._M_unused._M_object = (void *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)resolver.m_d.d
    ;
  }
  p_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_110.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_110.d = (Data *)resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  local_c8.d = (Data *)resolver_1.m_d.d;
  local_a8._M_unused._0_8_ = resolver.m_d.d;
  pQVar7 = (QSlotObjectBase *)operator_new(0x18);
  local_c0.d = local_110.d;
  if (local_110.d == (Data *)0x0) {
    QVar8.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QVar8.d = local_110.d;
  }
  (pQVar7->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar7->m_impl =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:138:43),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(Data **)(pQVar7 + 1) = QVar8.d;
  if (QVar8.d != (Data *)0x0) {
    LOCK();
    ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QTimer::singleShotImpl(1000,PreciseTimer,(QObject *)0x0,pQVar7);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_c0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_110);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&p_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&local_a8
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&local_78
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  local_88 = &PTR__QException_0011ba48;
  QtPromise::QPromiseBase<int>::timeout<QtPromise::QPromiseTimeoutException>
            (&local_50,(int)&local_b8,(QPromiseTimeoutException *)0x7d0);
  p_1.super_QPromiseBase<int>.m_d.d = local_50.m_d.d;
  if (local_50.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_50.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  local_138.d = (Data *)&PTR__QPromiseBase_0011bc70;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&this_00->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
  local_58 = (_func_int **)&PTR__QPromiseBase_0011ba98;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011bc28;
  local_138.ptr = (char16_t *)this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
  QVar2 = p_1.super_QPromiseBase<int>.m_d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_198._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_198._M_unused._0_8_ = (undefined8)resolver_1;
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if ((Data *)local_198._M_unused._0_8_ == (Data *)0x0) {
    local_1b0.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_198._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_198._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_1b0.d = (Data *)local_198._M_unused._0_8_;
  }
  local_1a0.d = (Data *)0x0;
  if ((Data *)local_198._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_198._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_198._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((PromiseData<int> *)local_1b0.d != (PromiseData<int> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &(((PromiseData<int> *)local_1b0.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
      _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (((QAtomicInt *)
          &(((PromiseData<int> *)local_1b0.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
           _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_198._8_8_ = local_1b0.d;
  local_188 = (undefined **)&elapsed;
  pPStack_180 = (PromiseData<int> *)&timer;
  local_148._vptr_QPromiseBase = (_func_int **)local_198._M_unused._0_8_;
  local_a8._M_unused._M_object = operator_new(0x20);
  *(void **)local_a8._M_unused._0_8_ = local_198._M_unused._M_object;
  if ((Data *)local_198._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = local_198._8_8_;
  if ((PromiseData<int> *)local_198._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_a8._M_unused._0_8_ + 0x10) = local_188;
  *(PromiseData<int> **)((long)local_a8._M_unused._0_8_ + 0x18) = pPStack_180;
  pcStack_90 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<int,tst_qpromise_timeout::rejectedStdChrono()::$_1,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_timeout::rejectedStdChrono()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)&local_198);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  QVar2 = p_1.super_QPromiseBase<int>.m_d;
  local_198._M_unused._M_object = local_148._vptr_QPromiseBase;
  if ((Data *)local_148._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_148._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_148._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_198._8_8_ = local_1b0.d;
  if ((PromiseData<int> *)local_1b0.d != (PromiseData<int> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_1b0.d)->super_QSharedData)->
      _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (((QAtomicInt *)
          &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_1b0.d)->super_QSharedData)->
           _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_188 = (undefined **)&elapsed;
  pPStack_180 = (PromiseData<int> *)&timer;
  local_78._M_unused._M_object = operator_new(0x20);
  *(void **)local_78._M_unused._0_8_ = local_198._M_unused._M_object;
  if ((Data *)local_198._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_198._8_8_;
  if ((PromiseData<int> *)local_198._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_78._M_unused._0_8_ + 0x10) = local_188;
  *(PromiseData<int> **)((long)local_78._M_unused._0_8_ + 0x18) = pPStack_180;
  pcStack_60 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<int,tst_qpromise_timeout::rejectedStdChrono()::$_1,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_timeout::rejectedStdChrono()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_198);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1b0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_148);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_2);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  local_138.d = (Data *)&PTR__QPromiseBase_0011bc28;
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p_1.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
    ;
  }
  pp_Var4 = local_58;
  local_148.m_d.d = p_1.super_QPromiseBase<int>.m_d.d;
  if (p_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_148._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  p.super_QPromiseBase<int>._vptr_QPromiseBase = local_58;
  pPVar6 = (PromiseData<int> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0011bac8;
  p.super_QPromiseBase<int>.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,(QPromise<int> *)&resolver_1);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver_1);
  pcVar3 = local_138.ptr;
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_1b0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_1b0 = resolver_2.m_d.d;
  }
  local_1a0.d = (Data *)0x0;
  if (local_1b0.d == (Data *)0x0) {
    local_198._8_8_ = (PromiseData<int> *)0x0;
  }
  else {
    LOCK();
    ((local_1b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_198._8_8_ = local_1b0.d;
  }
  local_108.d = (Data *)0x0;
  if (local_1b0.d != (Data *)0x0) {
    LOCK();
    ((local_1b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((PromiseData<int> *)local_198._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &(((PromiseData<int> *)local_198._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>).
      _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (((QAtomicInt *)
          &(((PromiseData<int> *)local_198._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>).
           _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPStack_180 = local_148.m_d.d;
  if (local_148.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_148.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_188 = &PTR__QPromiseBase_0011bac8;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  local_198._M_unused._0_8_ = (undefined8)local_1b0.d;
  local_100.d = (Data *)local_198._8_8_;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_198._M_unused._M_object;
  if ((Data *)local_198._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)local_198._8_8_;
  if ((PromiseData<int> *)local_198._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
    UNLOCK();
  }
  *(_func_int ***)((long)resolver.m_d.d + 0x10) = pp_Var4;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<int> *)pPStack_180;
  if (pPStack_180 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPStack_180->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0011bac8;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<int>::finally<tst_qpromise_timeout::rejectedStdChrono()::$_1>(tst_qpromise_timeout::rejectedStdChrono()::$_1)const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromiseBase<int>::finally<tst_qpromise_timeout::rejectedStdChrono()::$_1>(tst_qpromise_timeout::rejectedStdChrono()::$_1)const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)&local_198);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            ((PromiseDataBase<void,_void_()> *)pcVar3,(function<void_()> *)&resolver);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  pcVar3 = local_138.ptr;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_198,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_1b0,
             (QPromiseResolve<int> *)&local_100,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            ((PromiseDataBase<void,_void_()> *)pcVar3,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_198);
  std::_Function_base::~_Function_base((_Function_base *)&local_198);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_100);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_108);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1b0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)local_138.ptr);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)local_138.ptr);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_148);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_138);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p_1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_50);
  QException::~QException((QException *)&local_88);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_b8);
  p_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p_1.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  waitForError<int,QString>((QString *)&resolver_1,&p,(QString *)&p_1);
  QString::QString((QString *)&local_138,"foo");
  bVar5 = QTest::qCompare((QString *)&resolver_1,(QString *)&local_138,"waitForError(p, QString{})",
                          "QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                          ,0x92);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver_1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p_1);
  if (bVar5) {
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isRejected
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    resolver_1.m_d.d._0_1_ = bVar5;
    p_1.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(p_1.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,1);
    bVar5 = QTest::qCompare<bool,bool>
                      ((bool *)&resolver_1,(bool *)&p_1,"p.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                       ,0x93);
    if (bVar5) {
      QTest::qVerify(elapsed < 2000,"elapsed < 2000","",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                     ,0x94);
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_qpromise_timeout::rejectedStdChrono()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;

    timer.start();

    auto p = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>&,
                                         const QtPromise::QPromiseReject<int>& reject) {
                 QTimer::singleShot(1000, [=]() {
                     reject(QString{"foo"});
                 });
             }}.timeout(std::chrono::seconds{2})
                 .finally([&]() {
                     elapsed = timer.elapsed();
                 });

    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p.isRejected(), true);
    QVERIFY(elapsed < 2000);
}